

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

duckdb_varint * duckdb_get_varint(duckdb_varint *__return_storage_ptr__,duckdb_value val)

{
  pointer __src;
  string *value;
  uint8_t *__dest;
  size_t __size;
  bool is_negative;
  vector<unsigned_char,_true> byte_array;
  string_t local_78;
  Value v;
  
  duckdb::LogicalType::LogicalType((LogicalType *)&byte_array,VARINT);
  duckdb::Value::DefaultCastAs(&v,(Value *)val,(LogicalType *)&byte_array,false);
  duckdb::LogicalType::~LogicalType((LogicalType *)&byte_array);
  value = duckdb::StringValue::Get_abi_cxx11_(&v);
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  duckdb::string_t::string_t(&local_78,value);
  duckdb::Varint::GetByteArray(&byte_array,&is_negative,&local_78);
  __src = byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  __size = (long)byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  __dest = (uint8_t *)malloc(__size);
  switchD_00916250::default(__dest,__src,__size);
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->size = __size;
  __return_storage_ptr__->is_negative = is_negative;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_array);
  duckdb::Value::~Value(&v);
  return __return_storage_ptr__;
}

Assistant:

duckdb_varint duckdb_get_varint(duckdb_value val) {
	auto v = UnwrapValue(val).DefaultCastAs(duckdb::LogicalType::VARINT);
	auto &str = duckdb::StringValue::Get(v);
	duckdb::vector<uint8_t> byte_array;
	bool is_negative;
	duckdb::Varint::GetByteArray(byte_array, is_negative, duckdb::string_t(str));
	auto size = byte_array.size();
	auto data = reinterpret_cast<uint8_t *>(malloc(size));
	memcpy(data, byte_array.data(), size);
	return {data, size, is_negative};
}